

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O1

seconds __thiscall hedg::MarketGenerator::calc_time(MarketGenerator *this)

{
  int iVar1;
  
  iVar1 = this->time_span_;
  if (this->time_unit_ == mins) {
    iVar1 = iVar1 * 0x3c;
  }
  else if (this->time_unit_ == hours) {
    iVar1 = iVar1 * 0xe10;
  }
  return (seconds)(long)iVar1;
}

Assistant:

std::chrono::seconds MarketGenerator::calc_time() {
	int total_secs = 0;
	if (time_unit_ == Timing::time_unit::hours)
		total_secs += 3600 * time_span_;
	else if (time_unit_ == Timing::time_unit::mins)
		total_secs += 60 * time_span_;
	else
		total_secs += time_span_;
	return std::chrono::seconds(total_secs);
}